

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveRegToStackArg
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,BaseReg *reg)

{
  uint32_t uVar1;
  byte bVar2;
  InstId IVar3;
  Error EVar4;
  undefined8 extraout_RAX;
  uint uVar5;
  uint uVar6;
  InstId IVar7;
  BaseEmitter *this_00;
  byte bVar8;
  uint uVar9;
  bool bVar10;
  Mem stackPtr;
  Operand_ local_58;
  Operand_ local_48;
  Operand_ local_38;
  Operand_ local_28;
  
  uVar6 = arg->_data;
  if ((uVar6 >> 9 & 1) == 0) {
    moveRegToStackArg();
LAB_001480bb:
    moveRegToStackArg();
    __clang_call_terminate(extraout_RAX);
  }
  local_48._data[1] = (int)uVar6 >> 0xc;
  uVar5 = *(uint *)(*(long *)this + 0x1d8) & 0xf8;
  local_48._signature._bits = uVar5 + 2;
  local_48._baseId = *(uint32_t *)(*(long *)this + 0x1dc);
  local_48._data[0] = 0;
  local_58._signature._bits = 1;
  local_58._baseId = 0xff;
  local_58._data[0] = 0;
  local_58._data[1] = 0;
  local_38._signature._bits = 1;
  local_38._baseId = 0xff;
  local_38._data[0] = 0;
  local_38._data[1] = 0;
  this_00 = *(BaseEmitter **)(this + 8);
  uVar1 = (reg->super_Operand).super_Operand_._baseId;
  if (*(uint *)&this_00[3]._errorHandler <= uVar1 - 0x100) goto LAB_001480bb;
  bVar8 = *(byte *)(*(long *)(&((this_00[3]._logger)->_options)._indentation +
                             (ulong)(uVar1 - 0x100) * 2 + -3) + 0xd);
  uVar9 = uVar6 & 0xff;
  bVar2 = (byte)uVar6;
  if (0x19 < uVar9 - 0x22) {
    if (uVar9 != 0x46) goto switchD_00147ca5_caseD_2c;
switchD_00147ca5_caseD_2b:
    if (0x31 < (byte)(bVar8 - 0x33)) {
      return 0x19;
    }
    local_48._signature._bits = uVar5 | 0x8000002;
    local_58._baseId = uVar1;
    local_58._signature._bits = 0x10000161;
    bVar10 = this[0x292] == (RACFGBuilder)0x0;
    IVar3 = 0x4b9;
    IVar7 = 0x1c8;
LAB_00148077:
    if (!bVar10) {
      IVar7 = IVar3;
    }
    goto LAB_0014807a;
  }
  switch(uVar9) {
  case 0x22:
  case 0x23:
switchD_00147ca5_caseD_22:
    if (9 < (byte)(bVar8 - 0x20)) {
      if ((byte)(bVar8 - 0x31) < 2) {
        local_48._signature._bits = uVar5 | 0x4000002;
        local_58._baseId = uVar1;
        local_58._signature._bits = 0x8000391;
        bVar10 = this[0x292] == (RACFGBuilder)0x0;
        IVar3 = 0x4aa;
        IVar7 = 0x1bc;
        goto LAB_00148077;
      }
      goto joined_r0x00147d68;
    }
    local_48._signature._bits = uVar5 | 0x4000002;
    local_58._signature._bits = 0x4000031;
LAB_00147ecb:
    local_58._baseId = uVar1;
    break;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    if ((bVar8 & 0xfe) == 0x22) {
      bVar8 = bVar8 ^ 0x22;
      local_38._signature._bits = 0x1000019;
    }
    else {
      if ((bVar8 & 0xfe) != 0x24) goto switchD_00147ca5_caseD_22;
      bVar8 = bVar8 ^ 0x24;
      local_38._signature._bits = 0x2000029;
    }
    local_38._baseId = uVar1;
    local_48._signature._bits = uVar5 | 0x4000002;
    local_58._baseId = uVar1;
    local_58._signature._bits = 0x4000031;
    EVar4 = BaseEmitter::_emitI(this_00,(uint)(bVar8 != 0 || (bVar2 & 0xfd) != 0x24) * 4 + 0x1da,
                                &local_58,&local_38);
    if (EVar4 != 0) {
      return EVar4;
    }
    this_00 = *(BaseEmitter **)(this + 8);
    break;
  case 0x28:
  case 0x29:
    switch(bVar8 & 0xfe) {
    case 0x22:
      local_38._signature._bits = 0x1000019;
      bVar8 = bVar8 ^ 0x22;
      break;
    case 0x24:
      local_38._signature._bits = 0x2000029;
      bVar8 = bVar8 ^ 0x24;
      break;
    case 0x26:
      local_38._baseId = uVar1;
      local_38._signature._bits = 0x4000031;
      if ((bVar2 != 0x28) || (IVar7 = 0x1db, bVar8 != 0x26)) {
        local_48._signature._bits = uVar5 | 0x4000002;
        local_58._baseId = uVar1;
        local_58._signature._bits = 0x4000031;
        goto switchD_00147d13_caseD_26;
      }
      goto LAB_00147f47;
    case 0x28:
switchD_00147d13_caseD_28:
      local_48._signature._bits = uVar5 | 0x8000002;
      local_58._signature._bits = 0x8000039;
      goto LAB_00147ecb;
    default:
      if (1 < (byte)(bVar8 - 0x31)) goto switchD_00147ca5_caseD_2b;
LAB_00148011:
      local_48._signature._bits = uVar5 | 0x8000002;
      local_58._baseId = uVar1;
      local_58._signature._bits = 0x8000391;
      bVar10 = this[0x292] == (RACFGBuilder)0x0;
      IVar3 = 0x4c0;
      IVar7 = 0x1d3;
      goto LAB_00148077;
    }
    local_38._baseId = uVar1;
    IVar7 = (uint)(bVar8 != 0 || bVar2 != 0x28) * 4 + 0x1da;
    goto LAB_00147f47;
  case 0x2a:
  case 0x3b:
joined_r0x00147d68:
    if (0x31 < (byte)(bVar8 - 0x33)) {
      return 0x19;
    }
    local_48._signature._bits = uVar5 | 0x4000002;
    local_58._baseId = uVar1;
    local_58._signature._bits = 0x10000161;
    bVar10 = this[0x292] == (RACFGBuilder)0x0;
    IVar3 = 0x4c5;
    IVar7 = 0x1d9;
    goto LAB_00148077;
  case 0x2b:
    goto switchD_00147ca5_caseD_2b;
  default:
switchD_00147ca5_caseD_2c:
    uVar6 = uVar6 & 0xff;
    if (0x31 < uVar6 - 0x33) {
      return 0x19;
    }
    if (((reg->super_Operand).super_Operand_._signature._bits & 0xf00) != 0x100) {
      return 0x19;
    }
    local_48._signature._bits =
         (uint)(byte)TypeUtils::_typeData[(ulong)uVar6 + 0x100] << 0x18 | local_48._signature._bits;
    IVar7 = 0x1ba;
    if (this[0x292] != (RACFGBuilder)0x0) {
      IVar7 = 0x4a9;
    }
    if (uVar6 - 0x47 < 10) {
      local_58._signature._bits = 0x10000161;
    }
    else if (uVar6 - 0x51 < 10) {
      local_58._signature._bits = 0x20000169;
    }
    else {
      if (9 < uVar6 - 0x5b) {
        return 0x19;
      }
      local_58._signature._bits = 0x40000171;
    }
    local_58._baseId = uVar1;
    goto LAB_0014807a;
  case 0x31:
  case 0x32:
    switch(bVar8 & 0xfe) {
    case 0x22:
      local_38._signature._bits = 0x1000019;
      break;
    case 0x24:
      local_38._signature._bits = 0x2000029;
      break;
    case 0x26:
      goto switchD_00147d13_caseD_26;
    case 0x28:
      goto switchD_00147d13_caseD_28;
    default:
      if ((byte)(bVar8 - 0x31) < 2) goto LAB_00148011;
      goto switchD_00147ca5_caseD_2b;
    }
    local_38._baseId = uVar1;
    IVar7 = 0x1de;
LAB_00147f47:
    if (((this_00->_environment)._arch & k32BitMask) == kUnknown) {
      local_48._signature._bits = uVar5 | 0x8000002;
      local_58._baseId = uVar1;
      local_58._signature._bits = 0x8000039;
      EVar4 = BaseEmitter::_emitI(this_00,IVar7,&local_58,&local_38);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x1b7,&local_48,&local_58);
    }
    else {
      local_48._signature._bits = uVar5 | 0x4000002;
      local_58._baseId = uVar1;
      local_58._signature._bits = 0x4000031;
      EVar4 = BaseEmitter::_emitI(this_00,IVar7,&local_58,&local_38);
      if (EVar4 != 0) {
        return EVar4;
      }
      this_00 = *(BaseEmitter **)(this + 8);
switchD_00147d13_caseD_26:
      EVar4 = BaseEmitter::_emitI(this_00,0x1b7,&local_48,&local_58);
      if (EVar4 != 0) {
        return EVar4;
      }
      local_48._data[1] = local_48._data[1] + 4;
      local_28._signature._bits = 4;
      local_28._baseId = 0;
      local_28._data[0] = 0;
      local_28._data[1] = 0;
      EVar4 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x17,&local_48,&local_28);
    }
    if (EVar4 != 0) {
      return EVar4;
    }
    return 0;
  }
  IVar7 = 0x1b7;
LAB_0014807a:
  EVar4 = BaseEmitter::_emitI(this_00,IVar7,&local_48,&local_58);
  return EVar4;
}

Assistant:

Error RACFGBuilder::moveRegToStackArg(InvokeNode* invokeNode, const FuncValue& arg, const BaseReg& reg) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isStack());

  Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
  Reg r0, r1;

  VirtReg* vr = cc()->virtRegById(reg.id());
  uint32_t registerSize = cc()->registerSize();
  InstId instId = 0;

  TypeId dstTypeId = arg.typeId();
  TypeId srcTypeId = vr->typeId();

  switch (dstTypeId) {
    case TypeId::kInt64:
    case TypeId::kUInt64:
      // Extend BYTE->QWORD (GP).
      if (TypeUtils::isGp8(srcTypeId)) {
        r1.setRegT<RegType::kX86_GpbLo>(reg.id());

        instId = (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt8) ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend WORD->QWORD (GP).
      if (TypeUtils::isGp16(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpw>(reg.id());

        instId = (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt16) ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend DWORD->QWORD (GP).
      if (TypeUtils::isGp32(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpd>(reg.id());

        instId = Inst::kIdMovsxd;
        if (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt32)
          goto ExtendMovGpXQ;
        else
          goto ZeroExtendGpDQ;
      }

      // Move QWORD (GP).
      if (TypeUtils::isGp64(srcTypeId)) goto MovGpQ;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmQ;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // DWORD <- WORD (Zero|Sign Extend).
      if (TypeUtils::isGp16(srcTypeId)) {
        bool isDstSigned = dstTypeId == TypeId::kInt16 || dstTypeId == TypeId::kInt32;
        bool isSrcSigned = srcTypeId == TypeId::kInt8  || srcTypeId == TypeId::kInt16;

        r1.setRegT<RegType::kX86_Gpw>(reg.id());
        instId = isDstSigned && isSrcSigned ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpD;
      }

      // DWORD <- BYTE (Zero|Sign Extend).
      if (TypeUtils::isGp8(srcTypeId)) {
        bool isDstSigned = dstTypeId == TypeId::kInt16 || dstTypeId == TypeId::kInt32;
        bool isSrcSigned = srcTypeId == TypeId::kInt8  || srcTypeId == TypeId::kInt16;

        r1.setRegT<RegType::kX86_GpbLo>(reg.id());
        instId = isDstSigned && isSrcSigned ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpD;
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt8:
    case TypeId::kUInt8:
      if (TypeUtils::isInt(srcTypeId)) goto MovGpD;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmD;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmD;
      break;

    case TypeId::kMmx32:
    case TypeId::kMmx64:
      // Extend BYTE->QWORD (GP).
      if (TypeUtils::isGp8(srcTypeId)) {
        r1.setRegT<RegType::kX86_GpbLo>(reg.id());

        instId = Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend WORD->QWORD (GP).
      if (TypeUtils::isGp16(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpw>(reg.id());

        instId = Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      if (TypeUtils::isGp32(srcTypeId)) goto ExtendMovGpDQ;
      if (TypeUtils::isGp64(srcTypeId)) goto MovGpQ;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmQ;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    case TypeId::kFloat32:
    case TypeId::kFloat32x1:
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmD;
      break;

    case TypeId::kFloat64:
    case TypeId::kFloat64x1:
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    default:
      if (TypeUtils::isVec(dstTypeId) && reg.as<Reg>().isVec()) {
        stackPtr.setSize(TypeUtils::sizeOf(dstTypeId));
        uint32_t vMovInstId = choose(Inst::kIdMovaps, Inst::kIdVmovaps);

        if (TypeUtils::isVec128(dstTypeId))
          r0.setRegT<RegType::kX86_Xmm>(reg.id());
        else if (TypeUtils::isVec256(dstTypeId))
          r0.setRegT<RegType::kX86_Ymm>(reg.id());
        else if (TypeUtils::isVec512(dstTypeId))
          r0.setRegT<RegType::kX86_Zmm>(reg.id());
        else
          break;

        return cc()->emit(vMovInstId, stackPtr, r0);
      }
      break;
  }
  return DebugUtils::errored(kErrorInvalidAssignment);

  // Extend+Move Gp.
ExtendMovGpD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());

  ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));
  ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
  return kErrorOk;

ExtendMovGpXQ:
  if (registerSize == 8) {
    stackPtr.setSize(8);
    r0.setRegT<RegType::kX86_Gpq>(reg.id());

    ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
  }
  else {
    stackPtr.setSize(4);
    r0.setRegT<RegType::kX86_Gpd>(reg.id());

    ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));

ExtendMovGpDQ:
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
    stackPtr.addOffsetLo32(4);
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdAnd, stackPtr, 0));
  }
  return kErrorOk;

ZeroExtendGpDQ:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());
  goto ExtendMovGpDQ;

MovGpD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());
  return cc()->emit(Inst::kIdMov, stackPtr, r0);

MovGpQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Gpq>(reg.id());
  return cc()->emit(Inst::kIdMov, stackPtr, r0);

MovMmD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Mm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovd, Inst::kIdVmovd), stackPtr, r0);

MovMmQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Mm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), stackPtr, r0);

MovXmmD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Xmm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), stackPtr, r0);

MovXmmQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Xmm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovlps, Inst::kIdVmovlps), stackPtr, r0);
}